

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionarydata.cpp
# Opt level: O1

int32_t __thiscall
icu_63::BytesDictionaryMatcher::matches
          (BytesDictionaryMatcher *this,UText *text,int32_t maxLength,int32_t limit,int32_t *lengths
          ,int32_t *cpLengths,int32_t *values,int32_t *prefix)

{
  bool bVar1;
  uint inByte;
  UStringTrieResult UVar2;
  int32_t iVar3;
  int64_t iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  BytesTrie bt;
  int local_7c;
  BytesTrie local_68;
  int32_t *local_48;
  int32_t *local_40;
  int64_t local_38;
  
  local_68.bytes_ = (uint8_t *)this->characters;
  local_68.ownedArray_ = (uint8_t *)0x0;
  local_68.remainingMatchLength_ = -1;
  local_68.pos_ = local_68.bytes_;
  local_40 = cpLengths;
  local_38 = utext_getNativeIndex_63(text);
  local_48 = lengths;
  inByte = utext_next32_63(text);
  local_7c = 0;
  iVar6 = 0;
  while (iVar7 = iVar6, -1 < (int)inByte) {
    if (iVar6 == 0) {
      if ((this->transformConstant & 0x7f000000U) == 0x1000000) {
        if (inByte == 0x200d) {
          inByte = 0xff;
        }
        else if (inByte == 0x200c) {
          inByte = 0xfe;
        }
        else {
          inByte = inByte - (this->transformConstant & 0x1fffffU);
          if (0xfd < inByte) {
            inByte = 0xffffffff;
          }
        }
      }
      local_68.remainingMatchLength_ = -1;
      UVar2 = BytesTrie::nextImpl(&local_68,local_68.bytes_,(inByte >> 0x17 & 0x100) + inByte);
    }
    else {
      if ((this->transformConstant & 0x7f000000U) == 0x1000000) {
        if (inByte == 0x200d) {
          inByte = 0xff;
        }
        else if (inByte == 0x200c) {
          inByte = 0xfe;
        }
        else {
          inByte = inByte - (this->transformConstant & 0x1fffffU);
          if (0xfd < inByte) {
            inByte = 0xffffffff;
          }
        }
      }
      UVar2 = BytesTrie::next(&local_68,inByte);
    }
    iVar4 = utext_getNativeIndex_63(text);
    iVar7 = (int)iVar4 - (int)local_38;
    if ((int)UVar2 < 2) {
      if (UVar2 == USTRINGTRIE_NO_MATCH) goto LAB_0038ee70;
LAB_0038ee78:
      bVar1 = iVar7 < maxLength;
    }
    else {
      if (local_7c < limit) {
        lVar5 = (long)local_7c;
        if (values != (int32_t *)0x0) {
          iVar3 = BytesTrie::readValue(local_68.pos_ + 1,(uint)(*local_68.pos_ >> 1));
          values[lVar5] = iVar3;
        }
        if (local_48 != (int32_t *)0x0) {
          local_48[lVar5] = iVar7;
        }
        if (local_40 != (int32_t *)0x0) {
          local_40[lVar5] = iVar6 + 1;
        }
        local_7c = local_7c + 1;
      }
      if (UVar2 != USTRINGTRIE_FINAL_VALUE) goto LAB_0038ee78;
LAB_0038ee70:
      bVar1 = false;
    }
    iVar7 = iVar6 + 1;
    if (!bVar1) break;
    iVar6 = iVar6 + 1;
    inByte = utext_next32_63(text);
  }
  if (prefix != (int32_t *)0x0) {
    *prefix = iVar7;
  }
  BytesTrie::~BytesTrie(&local_68);
  return local_7c;
}

Assistant:

int32_t BytesDictionaryMatcher::matches(UText *text, int32_t maxLength, int32_t limit,
                            int32_t *lengths, int32_t *cpLengths, int32_t *values,
                            int32_t *prefix) const {
    BytesTrie bt(characters);
    int32_t startingTextIndex = (int32_t)utext_getNativeIndex(text);
    int32_t wordCount = 0;
    int32_t codePointsMatched = 0;

    for (UChar32 c = utext_next32(text); c >= 0; c=utext_next32(text)) {
        UStringTrieResult result = (codePointsMatched == 0) ? bt.first(transform(c)) : bt.next(transform(c));
        int32_t lengthMatched = (int32_t)utext_getNativeIndex(text) - startingTextIndex;
        codePointsMatched += 1;
        if (USTRINGTRIE_HAS_VALUE(result)) {
            if (wordCount < limit) {
                if (values != NULL) {
                    values[wordCount] = bt.getValue();
                }
                if (lengths != NULL) {
                    lengths[wordCount] = lengthMatched;
                }
                if (cpLengths != NULL) {
                    cpLengths[wordCount] = codePointsMatched;
                }
                ++wordCount;
            }
            if (result == USTRINGTRIE_FINAL_VALUE) {
                break;
            }
        }
        else if (result == USTRINGTRIE_NO_MATCH) {
            break;
        }
        if (lengthMatched >= maxLength) {
            break;
        }
    }

    if (prefix != NULL) {
        *prefix = codePointsMatched;
    }
    return wordCount;
}